

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedDynamicPaths::Run(AdvancedDynamicPaths *this)

{
  allocator<tcu::Vector<float,_4>_> *this_00;
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  size_type sVar4;
  reference this_01;
  float *pfVar5;
  CallLogWrapper *this_02;
  float *local_220;
  Vector<float,_4> local_1bc;
  Vector<float,_4> local_1ac;
  uint local_19c;
  undefined1 local_198 [4];
  int i;
  vec4 expected [4];
  vec4 data_4 [4];
  vec4 data_3 [4];
  int data_2 [4];
  vec4 data_1 [4];
  Vector<float,_4> local_80;
  undefined1 local_70 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  AdvancedDynamicPaths *this_local;
  
  local_20 = 
  "\nlayout(local_size_x = 4) in;\nlayout(std140, binding = 0) buffer Output {\n  vec4 g_output[4];\n};\nuniform isamplerBuffer g_path_buffer;\nuniform vec4[4] g_input0 = vec4[4](vec4(100), vec4(200), vec4(300), vec4(400));\nuniform samplerBuffer g_input1;\nlayout(binding = 1, std430) buffer Input2 {\n  vec4[4] g_input2;\n};\n\nvoid Path2(int id) {\n  g_output[id] = texelFetch(g_input1, int(gl_LocalInvocationIndex));\n}\nvoid main() {\n  const int id = int(gl_GlobalInvocationID.x);\n  const int path = texelFetch(g_path_buffer, id).x;\n\n  if (path == 0) {\n    g_output[id] = g_input0[gl_LocalInvocationID.x];\n    memoryBarrier();\n  } else if (path == 1) {\n    return;\n  } else if (path == 2) {\n    Path2(id);\n    return;\n  } else if (path == 3) {\n    g_output[id] = g_input2[path - 1];\n    memoryBarrierBuffer();\n  }\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(local_size_x = 4) in;\nlayout(std140, binding = 0) buffer Output {\n  vec4 g_output[4];\n};\nuniform isamplerBuffer g_path_buffer;\nuniform vec4[4] g_input0 = vec4[4](vec4(100), vec4(200), vec4(300), vec4(400));\nuniform samplerBuffer g_input1;\nlayout(binding = 1, std430) buffer Input2 {\n  vec4[4] g_input2;\n};\n\nvoid Path2(int id) {\n  g_output[id] = texelFetch(g_input1, int(gl_LocalInvocationIndex));\n}\nvoid main() {\n  const int id = int(gl_GlobalInvocationID.x);\n  const int path = texelFetch(g_path_buffer, id).x;\n\n  if (path == 0) {\n    g_output[id] = g_input0[gl_LocalInvocationID.x];\n    memoryBarrier();\n  } else if (path == 1) {\n    return;\n  } else if (path == 2) {\n    Path2(id);\n    return;\n  } else if (path == 3) {\n    g_output[id] = g_input2[path - 1];\n    memoryBarrierBuffer();\n  }\n}"
             ,&local_41);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_40);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
  if (bVar1) {
    this_02 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glGenBuffers(this_02,4,this->m_buffer);
    glu::CallLogWrapper::glGenTextures(this_02,2,this->m_texture);
    tcu::Vector<float,_4>::Vector(&local_80,-100.0);
    this_00 = (allocator<tcu::Vector<float,_4>_> *)((long)data_1[3].m_data + 0xf);
    std::allocator<tcu::Vector<float,_4>_>::allocator(this_00);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_70,4,
               &local_80,this_00);
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)data_1[3].m_data + 0xf));
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,this->m_buffer[0]);
    sVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_70);
    this_01 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_70,0);
    pfVar5 = tcu::Vector<float,_4>::operator[](this_01,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,sVar4 << 4,pfVar5,0x88ea);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_70);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data_2 + 2),1.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data_1[0].m_data + 2),2.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data_1[1].m_data + 2),3.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data_1[2].m_data + 2),4.0);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,1,this->m_buffer[1]);
    pfVar5 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(data_2 + 2),0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0x40,pfVar5,0x88ea);
    data_3[3].m_data[2] = 4.2039e-45;
    data_3[3].m_data[3] = 2.8026e-45;
    data_2[0] = 1;
    data_2[1] = 0;
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,this->m_buffer[2]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0x10,data_3[3].m_data + 2,0x88e4);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,this->m_texture[0]);
    glu::CallLogWrapper::glTexBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0x8235,this->m_buffer[2]);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data_4[3].m_data + 2),10.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data_3[0].m_data + 2),20.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data_3[1].m_data + 2),30.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data_3[2].m_data + 2),40.0);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,this->m_buffer[3]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0x40,data_4[3].m_data + 2,0x88e4);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,this->m_texture[1]);
    glu::CallLogWrapper::glTexBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0x8814,this->m_buffer[3]);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,this->m_program,"g_path_buffer");
    glu::CallLogWrapper::glUniform1i
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GVar3,0);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,this->m_program,"g_input1");
    glu::CallLogWrapper::glUniform1i
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GVar3,1);
    glu::CallLogWrapper::glActiveTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x84c0);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,this->m_texture[0]);
    glu::CallLogWrapper::glActiveTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x84c1);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,this->m_texture[1]);
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x200);
    local_220 = expected[3].m_data + 2;
    do {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_220);
      local_220 = local_220 + 4;
    } while (local_220 != data_4[3].m_data + 2);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_buffer[0]);
    pfVar5 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(expected[3].m_data + 2),0);
    glu::CallLogWrapper::glGetBufferSubData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,0x40,pfVar5);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_198,3.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(expected[0].m_data + 2),20.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(expected[1].m_data + 2),-100.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(expected[2].m_data + 2),400.0);
    for (local_19c = 0; (int)local_19c < 4; local_19c = local_19c + 1) {
      tcu::Vector<float,_4>::Vector
                (&local_1ac,(Vector<float,_4> *)(expected[(long)(int)local_19c + 3].m_data + 2));
      tcu::Vector<float,_4>::Vector
                (&local_1bc,(Vector<float,_4> *)(local_198 + (long)(int)local_19c * 0x10));
      bVar1 = ComputeShaderBase::IsEqual(&this->super_ComputeShaderBase,&local_1ac,&local_1bc);
      if (!bVar1) {
        anon_unknown_0::Output("Invalid data at index %d.\n",(ulong)local_19c);
        return (long)&DAT_ffffffffffffffff;
      }
    }
    this_local = (AdvancedDynamicPaths *)0x0;
  }
  else {
    this_local = (AdvancedDynamicPaths *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 4) in;" NL "layout(std140, binding = 0) buffer Output {" NL
			   "  vec4 g_output[4];" NL "};" NL "uniform isamplerBuffer g_path_buffer;" NL
			   "uniform vec4[4] g_input0 = vec4[4](vec4(100), vec4(200), vec4(300), vec4(400));" NL
			   "uniform samplerBuffer g_input1;" NL "layout(binding = 1, std430) buffer Input2 {" NL
			   "  vec4[4] g_input2;" NL "};" NL NL "void Path2(int id) {" NL
			   "  g_output[id] = texelFetch(g_input1, int(gl_LocalInvocationIndex));" NL "}" NL "void main() {" NL
			   "  const int id = int(gl_GlobalInvocationID.x);" NL
			   "  const int path = texelFetch(g_path_buffer, id).x;" NL NL "  if (path == 0) {" NL
			   "    g_output[id] = g_input0[gl_LocalInvocationID.x];" NL "    memoryBarrier();" NL
			   "  } else if (path == 1) {" NL "    return;" NL "  } else if (path == 2) {" NL "    Path2(id);" NL
			   "    return;" NL "  } else if (path == 3) {" NL "    g_output[id] = g_input2[path - 1];" NL
			   "    memoryBarrierBuffer();" NL "  }" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(4, m_buffer);
		glGenTextures(2, m_texture);

		/* init 'output' buffer */
		{
			std::vector<vec4> data(4, vec4(-100.0f));
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(sizeof(vec4) * data.size()), &data[0][0],
						 GL_DYNAMIC_COPY);
		}
		/* init 'input2' buffer */
		{
			const vec4 data[4] = { vec4(1.0f), vec4(2.0f), vec4(3.0f), vec4(4.0f) };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data[0][0], GL_DYNAMIC_COPY);
		}
		/* init 'path' buffer */
		{
			const int data[4] = { 3, 2, 1, 0 };
			glBindBuffer(GL_TEXTURE_BUFFER, m_buffer[2]);
			glBufferData(GL_TEXTURE_BUFFER, sizeof(data), &data[0], GL_STATIC_DRAW);
			glBindBuffer(GL_TEXTURE_BUFFER, 0);
			glBindTexture(GL_TEXTURE_BUFFER, m_texture[0]);
			glTexBuffer(GL_TEXTURE_BUFFER, GL_R32I, m_buffer[2]);
			glBindTexture(GL_TEXTURE_BUFFER, 0);
		}
		/* init 'input1' buffer */
		{
			const vec4 data[4] = { vec4(10.0f), vec4(20.0f), vec4(30.0f), vec4(40.0f) };
			glBindBuffer(GL_TEXTURE_BUFFER, m_buffer[3]);
			glBufferData(GL_TEXTURE_BUFFER, sizeof(data), &data[0], GL_STATIC_DRAW);
			glBindBuffer(GL_TEXTURE_BUFFER, 0);
			glBindTexture(GL_TEXTURE_BUFFER, m_texture[1]);
			glTexBuffer(GL_TEXTURE_BUFFER, GL_RGBA32F, m_buffer[3]);
			glBindTexture(GL_TEXTURE_BUFFER, 0);
		}

		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_path_buffer"), 0);
		glUniform1i(glGetUniformLocation(m_program, "g_input1"), 1);
		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_BUFFER, m_texture[0]);
		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_BUFFER, m_texture[1]);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate 'output' buffer */
		{
			vec4 data[4];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[0]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data[0][0]);

			const vec4 expected[4] = { vec4(3.0f), vec4(20.0f), vec4(-100.0f), vec4(400.0f) };
			for (int i = 0; i < 4; ++i)
			{
				if (!IsEqual(data[i], expected[i]))
				{
					Output("Invalid data at index %d.\n", i);
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}